

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall
chrono::ChSystemDescriptor::FromVectorToVariables
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  ChVariables *pCVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  uint uVar14;
  Index size;
  Index index;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ChVectorRef local_48;
  
  iVar13 = (*this->_vptr_ChSystemDescriptor[7])();
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (long)iVar13) {
    __assert_fail("CountActiveVariables() == mvector.rows()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x17c,
                  "virtual int chrono::ChSystemDescriptor::FromVectorToVariables(const ChVectorDynamic<> &)"
                 );
  }
  lVar20 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar20 != 0) {
    lVar20 = lVar20 >> 3;
    lVar21 = 0;
    do {
      pCVar4 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar21];
      if (pCVar4->disabled == false) {
        uVar3 = pCVar4->offset;
        lVar16 = (long)(int)uVar3;
        uVar14 = (*pCVar4->_vptr_ChVariables[2])();
        pdVar5 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar14 < 0 && pdVar5 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        if (((int)(uVar14 | uVar3) < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows - (long)(int)uVar14 < lVar16)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        ChVariables::Get_qb(&local_48,
                            (this->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar21]);
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != (long)(int)uVar14) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                       );
        }
        uVar15 = local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
        if (((local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ & 7) == 0) &&
           (uVar15 = (ulong)(-((uint)((ulong)local_48.
                                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                             ._0_8_ >> 3) & 0x1fffffff) & 7),
           (long)local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_ <= (long)uVar15)) {
          uVar15 = local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_;
        }
        uVar18 = local_48.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_ - uVar15;
        uVar17 = uVar18 + 7;
        if (-1 < (long)uVar18) {
          uVar17 = uVar18;
        }
        if (0 < (long)uVar15) {
          uVar19 = 0;
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar19 * 8) = pdVar5[lVar16 + uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
        }
        uVar17 = (uVar17 & 0xfffffffffffffff8) + uVar15;
        if (7 < (long)uVar18) {
          do {
            pdVar1 = pdVar5 + lVar16 + uVar15;
            dVar6 = pdVar1[1];
            dVar7 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar9 = pdVar1[4];
            dVar10 = pdVar1[5];
            dVar11 = pdVar1[6];
            dVar12 = pdVar1[7];
            pdVar2 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar15 * 8);
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar6;
            pdVar2[2] = dVar7;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar9;
            pdVar2[5] = dVar10;
            pdVar2[6] = dVar11;
            pdVar2[7] = dVar12;
            uVar15 = uVar15 + 8;
          } while ((long)uVar15 < (long)uVar17);
        }
        if ((long)uVar17 <
            (long)local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar17 * 8) = pdVar5[lVar16 + uVar17];
            uVar17 = uVar17 + 1;
          } while (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._8_8_ != uVar17);
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar20 + (ulong)(lVar20 == 0));
  }
  return this->n_q;
}

Assistant:

int ChSystemDescriptor::FromVectorToVariables(const ChVectorDynamic<>& mvector) {
    assert(CountActiveVariables() == mvector.rows());

    // fetch from the vector
    auto vv_size = vvariables.size();
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->Get_qb() = mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof());
        }
    }

    return n_q;
}